

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SCD.cpp
# Opt level: O0

DomSetType * __thiscall
dg::llvmdg::PostDominanceFrontiers::calculate
          (PostDominanceFrontiers *this,PostDominatorTree *DT,DomTreeNode *Node)

{
  bool bVar1;
  DomTreeNode *Node_00;
  long lVar2;
  PostDominatorTree *pPVar3;
  ulong uVar4;
  PostDominatorTree *in_RDX;
  BasicBlock *in_RSI;
  pair<std::_Rb_tree_const_iterator<llvm::BasicBlock_*>,_bool> pVar5;
  BasicBlock *cdfi;
  iterator __end3_1;
  iterator __begin3_1;
  DomSetType *__range3_1;
  DomSetType *ChildDF;
  DomTreeNodeBase<llvm::BasicBlock> *IDominee;
  const_iterator __end2;
  const_iterator __begin2;
  DomTreeNode *__range2;
  DomTreeNodeBase<llvm::BasicBlock> *SINode;
  BasicBlock *P;
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> __end3;
  PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> __begin3;
  pred_range *__range3;
  bool empty_roots;
  mapped_type *S;
  BasicBlock *BB;
  set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
  *in_stack_ffffffffffffff08;
  BasicBlock *in_stack_ffffffffffffff10;
  _Rb_tree_const_iterator<llvm::BasicBlock_*> in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff30;
  undefined7 in_stack_ffffffffffffff31;
  _Self local_c0;
  _Self in_stack_ffffffffffffff48;
  map<llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
  *in_stack_ffffffffffffff50;
  long local_90;
  pred_range local_50;
  iterator_range<llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>_>
  *local_40;
  undefined1 local_31;
  mapped_type *local_30;
  DomTreeNodeBase *pDVar6;
  BasicBlock *pBVar7;
  mapped_type *local_8;
  
  Node_00 = (DomTreeNode *)llvm::DomTreeNodeBase<llvm::BasicBlock>::getBlock();
  local_30 = std::
             map<llvm::BasicBlock_*,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>,_std::less<llvm::BasicBlock_*>,_std::allocator<std::pair<llvm::BasicBlock_*const,_std::set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>_>_>_>
             ::operator[](in_stack_ffffffffffffff50,(key_type *)in_stack_ffffffffffffff48._M_node);
  lVar2 = llvm::DominatorTreeBase<llvm::BasicBlock,true>::root_size();
  local_31 = lVar2 == 0;
  if ((bool)local_31) {
    local_8 = local_30;
  }
  else {
    if (Node_00 != (DomTreeNode *)0x0) {
      local_50 = llvm::predecessors(in_stack_ffffffffffffff10);
      local_40 = &local_50;
      llvm::
      iterator_range<llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>_>
      ::begin(local_40);
      llvm::
      iterator_range<llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>_>
      ::end(local_40);
      while (bVar1 = llvm::
                     PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
                     operator!=((PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>
                                 *)in_stack_ffffffffffffff10,(Self *)in_stack_ffffffffffffff08),
            bVar1) {
        llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
        operator*((PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> *)
                  0x26f698);
        lVar2 = llvm::DominatorTreeBase<llvm::BasicBlock,true>::operator[](in_RSI);
        if ((lVar2 != 0) &&
           (pPVar3 = (PostDominatorTree *)llvm::DomTreeNodeBase<llvm::BasicBlock>::getIDom(),
           pPVar3 != in_RDX)) {
          std::
          set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
          ::insert((set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
                    *)CONCAT71(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30),
                   (value_type *)in_stack_ffffffffffffff28._M_node);
        }
        llvm::PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_>::
        operator++((PredIterator<llvm::BasicBlock,_llvm::Value::user_iterator_impl<llvm::User>_> *)
                   in_stack_ffffffffffffff10);
      }
    }
    local_90 = llvm::DomTreeNodeBase<llvm::BasicBlock>::begin();
    lVar2 = llvm::DomTreeNodeBase<llvm::BasicBlock>::end();
    for (; local_90 != lVar2; local_90 = local_90 + 8) {
      calculate((PostDominanceFrontiers *)in_RSI,in_RDX,Node_00);
      std::
      set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>::
      begin(in_stack_ffffffffffffff08);
      local_c0._M_node =
           (_Base_ptr)
           std::
           set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
           ::end(in_stack_ffffffffffffff08);
      while (bVar1 = std::operator!=((_Self *)&stack0xffffffffffffff48,&local_c0), bVar1) {
        std::_Rb_tree_const_iterator<llvm::BasicBlock_*>::operator*
                  ((_Rb_tree_const_iterator<llvm::BasicBlock_*> *)0x26f7c4);
        pDVar6 = (DomTreeNodeBase *)in_RDX;
        pBVar7 = in_RSI;
        llvm::DominatorTreeBase<llvm::BasicBlock,true>::operator[](in_RSI);
        uVar4 = llvm::DominatorTreeBase<llvm::BasicBlock,true>::properlyDominates
                          ((DomTreeNodeBase *)in_RSI,(DomTreeNodeBase *)in_RDX);
        in_RDX = (PostDominatorTree *)pDVar6;
        if ((uVar4 & 1) == 0) {
          pVar5 = std::
                  set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
                  ::insert((set<llvm::BasicBlock_*,_std::less<llvm::BasicBlock_*>,_std::allocator<llvm::BasicBlock_*>_>
                            *)CONCAT71(in_stack_ffffffffffffff31,in_stack_ffffffffffffff30),
                           (value_type *)in_stack_ffffffffffffff28._M_node);
          in_stack_ffffffffffffff28 = pVar5.first._M_node;
          in_stack_ffffffffffffff30 = pVar5.second;
          in_RDX = (PostDominatorTree *)pDVar6;
        }
        std::_Rb_tree_const_iterator<llvm::BasicBlock_*>::operator++
                  ((_Rb_tree_const_iterator<llvm::BasicBlock_*> *)in_RSI);
        in_RSI = pBVar7;
      }
    }
    local_8 = local_30;
  }
  return local_8;
}

Assistant:

DomSetType &calculate(const llvm::PostDominatorTree &DT,
                          const llvm::DomTreeNode *Node) {
        llvm::BasicBlock *BB = Node->getBlock();
        auto &S = frontiers[BB];

#if LLVM_VERSION_MAJOR >= 11
        bool empty_roots = DT.root_size() == 0;
#else
        bool empty_roots = DT.getRoots().empty();
#endif
        if (empty_roots)
            return S;

        // calculate DFlocal[Node]
        if (BB) {
            for (auto *P : predecessors(BB)) {
                // Does Node immediately dominate this predecessor?
                auto *SINode = DT[P];
                if (SINode && SINode->getIDom() != Node)
                    S.insert(P);
            }
        }

        // At this point, S is DFlocal.  Now we union in DFup's of our children.
        // Loop through and visit the nodes that Node immediately dominates
        // (Node's children in the IDomTree)
        for (auto *IDominee : *Node) {
            const auto &ChildDF = calculate(DT, IDominee);

            for (auto *cdfi : ChildDF) {
                if (!DT.properlyDominates(Node, DT[cdfi]))
                    S.insert(cdfi);
            }
        }

        return S;
    }